

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_unittest.h
# Opt level: O0

void __thiscall
google::protobuf::internal::gtest_suite_Utf8ValidationTest_::
WriteInvalidUTF8String<proto2_unittest::TestAllTypes>::WriteInvalidUTF8String
          (WriteInvalidUTF8String<proto2_unittest::TestAllTypes> *this)

{
  WriteInvalidUTF8String<proto2_unittest::TestAllTypes> *this_local;
  
  Utf8ValidationTest<proto2_unittest::TestAllTypes>::Utf8ValidationTest
            (&this->super_Utf8ValidationTest<proto2_unittest::TestAllTypes>);
  (this->super_Utf8ValidationTest<proto2_unittest::TestAllTypes>).super_Test._vptr_Test =
       (_func_int **)&PTR__WriteInvalidUTF8String_029f7560;
  return;
}

Assistant:

TYPED_TEST_P(Utf8ValidationTest, WriteInvalidUTF8String) {
  std::string wire_buffer;
  typename TestFixture::OneString input;
  std::vector<std::string> errors;
  {
    absl::ScopedMockLog log(absl::MockLogDefault::kDisallowUnexpected);
#ifdef GOOGLE_PROTOBUF_UTF8_VALIDATION_ENABLED
    EXPECT_CALL(
        log,
        Log(absl::LogSeverity::kError, testing::_,
            absl::StrCat("String field '",
                         TestFixture::OneString::descriptor()->full_name(),
                         ".data' contains invalid UTF-8 data when "
                         "serializing a protocol buffer. Use the "
                         "'bytes' type if you intend to send raw bytes. ")));
#else
    EXPECT_CALL(log, Log(absl::LogSeverity::kError, testing::_, testing::_))
        .Times(0);
#endif  // GOOGLE_PROTOBUF_UTF8_VALIDATION_ENABLED
    log.StartCapturingLogs();
    WriteMessage(this->kInvalidUTF8String, &input, &wire_buffer);
  }
}